

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::all2all<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_int> *msgs,size_t size,comm *comm)

{
  comm *size_00;
  size_t msgs_00;
  int iVar1;
  reference out;
  allocator<std::pair<int,_int>_> local_2a;
  undefined1 local_29;
  comm *local_28;
  comm *comm_local;
  size_t size_local;
  pair<int,_int> *msgs_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result;
  
  local_29 = 0;
  local_28 = (comm *)size;
  comm_local = (comm *)msgs;
  size_local = (size_t)this;
  msgs_local = (pair<int,_int> *)__return_storage_ptr__;
  iVar1 = mxx::comm::size((comm *)size);
  std::allocator<std::pair<int,_int>_>::allocator(&local_2a);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__,(long)msgs * (long)iVar1,&local_2a);
  std::allocator<std::pair<int,_int>_>::~allocator(&local_2a);
  msgs_00 = size_local;
  size_00 = comm_local;
  out = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                  (__return_storage_ptr__,0);
  all2all<std::pair<int,int>>((pair<int,_int> *)msgs_00,(size_t)size_00,out,local_28);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2all(const T* msgs, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size*comm.size());
    all2all(msgs, size, &result[0], comm);
    return result;
}